

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

void __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::free
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this,void *__ptr)

{
  bool bVar1;
  
  std::_Function_base::~_Function_base((_Function_base *)__ptr);
  *(__pointer_type *)((long)__ptr + 0x28) = (this->head_)._M_b._M_p;
  do {
    bVar1 = std::atomic<depspawn::internal::TaskPool::Task_*>::compare_exchange_weak
                      (&this->head_,(__pointer_type *)((long)__ptr + 0x28),
                       (__pointer_type)
                       (((ulong)*(ushort *)((long)__ptr + 0x2e) << 0x30) + 0x1000000000000 |
                       (ulong)__ptr),memory_order_seq_cst);
  } while (!bVar1);
  return;
}

Assistant:

void free(T* const datain) noexcept(ALLOC_ONCE)
  {
    if (!ALLOC_ONCE) {
      datain->~T();
    }

    datain->next = head_.load(std::memory_order_relaxed);
    while(!head_.compare_exchange_weak(datain->next, next_ptr(datain, datain->next)));
  }